

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_object.cpp
# Opt level: O2

string __thiscall mjs::regexp_object::to_string(regexp_object *this)

{
  gc_heap *h;
  wostream *pwVar1;
  undefined8 extraout_RDX;
  long in_RSI;
  string sVar2;
  wostringstream woss;
  wstring_view local_1c0;
  gc_heap_ptr_untyped local_1b0 [2];
  wostringstream local_190 [376];
  
  std::__cxx11::wostringstream::wostringstream(local_190);
  pwVar1 = std::operator<<((wostream *)local_190,"/");
  gc_heap_ptr_untracked<mjs::gc_string,_true>::track
            ((gc_heap_ptr_untracked<mjs::gc_string,_true> *)&local_1c0,(gc_heap *)(in_RSI + 0x28));
  gc_heap_ptr_untyped::gc_heap_ptr_untyped(local_1b0,(gc_heap_ptr_untyped *)&local_1c0);
  pwVar1 = mjs::operator<<(pwVar1,(string *)local_1b0);
  pwVar1 = std::operator<<(pwVar1,"/");
  mjs::operator<<(pwVar1,*(regexp_flag *)(in_RSI + 0x38));
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(local_1b0);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_1c0);
  h = *(gc_heap **)(in_RSI + 8);
  std::__cxx11::wstringbuf::str();
  local_1c0._M_len = local_1b0[0]._8_8_;
  local_1c0._M_str = (wchar_t *)local_1b0[0].heap_;
  string::string((string *)this,h,&local_1c0);
  std::__cxx11::wstring::~wstring((wstring *)local_1b0);
  std::__cxx11::wostringstream::~wostringstream(local_190);
  sVar2.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped._8_8_ = extraout_RDX;
  sVar2.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)this;
  return (string)sVar2.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped;
}

Assistant:

string to_string() const {
        std::wostringstream woss;
        woss << "/" << source_.track(heap()) << "/" << flags_;
        return string{heap(), woss.str()};
    }